

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.cpp
# Opt level: O1

size_t __thiscall
TransitionObservationIndependentMADPDiscrete::ConstructJointObservationsRecursively
          (TransitionObservationIndependentMADPDiscrete *this,Index curAgentI,
          JointObservationDiscrete *jo,Index joI)

{
  pointer *pppJVar1;
  pointer pOVar2;
  ObservationDiscrete *a;
  pointer pvVar3;
  pointer pOVar4;
  pointer pOVar5;
  iterator __position;
  JointObservationDiscrete *this_00;
  size_t sVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  ulong uVar9;
  long lVar10;
  undefined4 in_register_00000034;
  ulong uVar11;
  Index joI_00;
  JointObservationDiscrete *p_jo;
  allocator<char> local_221;
  TransitionObservationIndependentMADPDiscrete *local_220;
  ulong local_218;
  JointObservationDiscrete *local_210;
  undefined8 local_208;
  Index local_1fc;
  JointObservationDiscrete *local_1f8;
  ulong local_1f0;
  vector<JointObservationDiscrete*,std::allocator<JointObservationDiscrete*>> *local_1e8;
  ObservationDiscrete *local_1e0;
  char *local_1d8;
  JointObservationDiscrete *local_1b8 [2];
  ostream local_1a8 [376];
  
  local_208 = CONCAT44(in_register_00000034,curAgentI);
  sVar6 = (size_t)joI;
  uVar11 = (ulong)curAgentI;
  local_1f8 = jo;
  local_1f0 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))();
  pvVar3 = (this->_m_indivObs).
           super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = ((long)(this->_m_indivObs).
                 super__Vector_base<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>,_std::allocator<std::vector<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3 >> 3) *
          -0x5555555555555555;
  local_220 = this;
  local_218 = uVar11;
  if (uVar9 < uVar11 || uVar9 - uVar11 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"ConstructJointObservationsRecursively - current Agent index (",0x3d);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,") out of bounds! (_m_indivObs contains ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"observations for ",0x11);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," agents...)\n",0xc);
    puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar8 = &PTR__E_0059bd80;
    std::__cxx11::string::string<std::allocator<char>>((string *)(puVar8 + 1),local_1d8,&local_221);
    __cxa_throw(puVar8,&E::typeinfo,E::~E);
  }
  pOVar4 = pvVar3[uVar11].
           super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar5 = *(pointer *)
            ((long)&pvVar3[uVar11].
                    super__Vector_base<ObservationDiscrete,_std::allocator<ObservationDiscrete>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pOVar4 != pOVar5) {
    local_210 = (JointObservationDiscrete *)operator_new(0x48);
    JointObservationDiscrete::JointObservationDiscrete(local_210,local_1f8);
    if (pOVar4 != pOVar5) {
      local_1f0 = local_1f0 - 1;
      local_1e0 = pOVar5 + -1;
      local_1fc = (int)local_208 + 1;
      local_1e8 = (vector<JointObservationDiscrete*,std::allocator<JointObservationDiscrete*>> *)
                  &local_220->_m_jointObs;
      lVar10 = 0;
      do {
        a = (ObservationDiscrete *)
            ((long)&(pOVar4->super_Observation).super_NamedDescribedEntity.
                    _vptr_NamedDescribedEntity + lVar10);
        this_00 = local_1f8;
        if ((lVar10 != 0) && (this_00 = local_210, a != local_1e0)) {
          this_00 = (JointObservationDiscrete *)operator_new(0x48);
          JointObservationDiscrete::JointObservationDiscrete(this_00,local_210);
          uVar11 = local_218;
        }
        local_1b8[0] = this_00;
        joI_00 = (Index)sVar6;
        if (local_1f0 == uVar11) {
          (local_1b8[0]->super_DiscreteEntity)._m_index = joI_00;
          JointObservationDiscrete::AddIndividualObservation(local_1b8[0],a,(Index)local_208);
          __position._M_current =
               (local_220->_m_jointObs).
               super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_220->_m_jointObs).
              super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<JointObservationDiscrete*,std::allocator<JointObservationDiscrete*>>::
            _M_realloc_insert<JointObservationDiscrete*const&>(local_1e8,__position,local_1b8);
          }
          else {
            *__position._M_current = local_1b8[0];
            pppJVar1 = &(local_220->_m_jointObs).
                        super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppJVar1 = *pppJVar1 + 1;
          }
          sVar6 = (size_t)(joI_00 + 1);
        }
        else {
          JointObservationDiscrete::AddIndividualObservation(local_1b8[0],a,(Index)local_208);
          sVar6 = ConstructJointObservationsRecursively(local_220,local_1fc,local_1b8[0],joI_00);
        }
        pOVar2 = (pointer)((long)&pOVar4[1].super_Observation.super_NamedDescribedEntity.
                                  _vptr_NamedDescribedEntity + lVar10);
        lVar10 = lVar10 + 0x58;
      } while (pOVar2 != pOVar5);
    }
    return sVar6 & 0xffffffff;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8," empty observation set for agent ",0x21);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  puVar8 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar8 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar8,&E::typeinfo,E::~E);
}

Assistant:

size_t TransitionObservationIndependentMADPDiscrete::
ConstructJointObservationsRecursively( 
    Index curAgentI, JointObservationDiscrete& jo, Index joI)
{
    bool lastAgent=false;
    if(curAgentI == GetNrAgents()-1)
    {
        lastAgent = true;    
    }    
    if(curAgentI >= _m_indivObs.size())
    {
        stringstream ss;
        ss << "ConstructJointObservationsRecursively - current Agent index ("<<
            curAgentI<<") out of bounds! (_m_indivObs contains "<<
            "observations for "<<_m_indivObs.size() << " agents...)\n";
        throw E(ss.str().c_str());
    }
    ObservationDVec::iterator first = _m_indivObs[curAgentI].begin();
    ObservationDVec::iterator it = _m_indivObs[curAgentI].begin();
    ObservationDVec::iterator last = _m_indivObs[curAgentI].end();
    ObservationDVec::iterator beforelast = _m_indivObs[curAgentI].end();
    beforelast--;

    if(it == last)
    {
        stringstream ss;
            ss << " empty observation set for agent " << curAgentI;
        throw E(ss);
    }
    //first observation extends the received jo 
    JointObservationDiscrete* p_joReceivedArgCopy =
        new JointObservationDiscrete(jo);
    JointObservationDiscrete* p_jo;
        
    while( it != last) // other observations extend duplicates of jo
    {
        if(it == first) //
        {
            p_jo = &jo;
        }
        else if (it == beforelast)//this is the last valid it -> last observation   
        {
            p_jo = p_joReceivedArgCopy; //don't make a new copy
        }
        else //make a new copy
        {        
            p_jo = new JointObservationDiscrete(*p_joReceivedArgCopy);    
        }    
        if(lastAgent)
        {
            p_jo->SetIndex(joI);
            if(DEBUG_CJO)    
                cerr << "setting index of this observation to: "<< joI <<endl;
        }
        ObservationDiscrete* ai = /*(ObservationDiscrete*)*/ &(*it);
        if(DEBUG_CJO)    
            cerr << "Adding agent's indiv. observation to joint observation..."<<endl;
        p_jo->AddIndividualObservation(ai, curAgentI);
        
        if(lastAgent)//jointObservation is now completed:add it to the jointObservation set.
        {
            if(DEBUG_CJO)
            {cerr<<"INSERTING the joint observation:"; p_jo->Print();cerr<<endl;}
            _m_jointObs.push_back(p_jo);
            if(DEBUG_CJO){cerr << "\nINSERTED the joint observation"<<endl<< "_m_jointObservationVec now containts "<< _m_jointObs.size() << " joint actions." << endl;}
            joI++;
        }
        else
            joI = ConstructJointObservationsRecursively(curAgentI+1,*p_jo, joI);
        it++;
    }
    if(DEBUG_CJO)    cerr << ">> TransitionObservationIndependentMADPDiscrete::ConstructJointObservationsRecursively(Index "<<curAgentI<<", JointObservationDiscrete& jo, Index "<< joI<<") FINISHED"<<endl;
    return joI;
    
}